

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_tasking.cpp
# Opt level: O1

void * __kmp_task_reduction_init<kmp_taskred_input>(int gtid,int num,kmp_taskred_input *data)

{
  undefined8 *puVar1;
  uint uVar2;
  kmp_info_t *th;
  kmp_taskgroup_t *pkVar3;
  void *pvVar4;
  void *pvVar5;
  kmp_taskred_input *pkVar6;
  size_t sVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  long lVar11;
  
  th = __kmp_threads[gtid];
  pkVar3 = ((th->th).th_current_task)->td_taskgroup;
  uVar2 = (th->th).th_team_nproc;
  if (pkVar3 == (kmp_taskgroup_t *)0x0) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_tasking.cpp"
                       ,0x844);
  }
  if (data == (kmp_taskred_input *)0x0) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_tasking.cpp"
                       ,0x845);
  }
  if (num < 1) {
    __kmp_debug_assert("assertion failure",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_tasking.cpp"
                       ,0x846);
  }
  if (uVar2 != 1) {
    pvVar4 = ___kmp_thread_malloc(th,(long)num * 0x48);
    if (0 < num) {
      uVar10 = 0;
      do {
        sVar7 = data[uVar10].reduce_size;
        if (data[uVar10].reduce_comb == (void *)0x0) {
          __kmp_debug_assert("assertion failure",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jmellorcrummey[P]llvm-openmp-5/runtime/src/kmp_tasking.cpp"
                             ,0x854);
        }
        pkVar6 = data + uVar10;
        lVar9 = (sVar7 - ((int)sVar7 - 1U & 0x3f)) + 0x3f;
        *(void **)((long)pvVar4 + uVar10 * 0x48) = pkVar6->reduce_shar;
        *(long *)((long)pvVar4 + uVar10 * 0x48 + 8) = lVar9;
        *(kmp_taskred_flags_t *)((long)pvVar4 + uVar10 * 0x48 + 0x10) = pkVar6->flags;
        *(void **)((long)pvVar4 + uVar10 * 0x48 + 0x28) = pkVar6->reduce_comb;
        pvVar5 = pkVar6->reduce_fini;
        puVar1 = (undefined8 *)((long)pvVar4 + uVar10 * 0x48 + 0x30);
        *puVar1 = pkVar6->reduce_init;
        puVar1[1] = pvVar5;
        pvVar5 = pkVar6->reduce_orig;
        if (pvVar5 == (void *)0x0) {
          pvVar5 = pkVar6->reduce_shar;
        }
        *(void **)((long)pvVar4 + uVar10 * 0x48 + 0x40) = pvVar5;
        if ((*(byte *)((long)pvVar4 + uVar10 * 0x48 + 0x10) & 1) == 0) {
          sVar7 = lVar9 * (int)uVar2;
          pvVar5 = ___kmp_allocate(sVar7);
          *(void **)((long)pvVar4 + uVar10 * 0x48 + 0x18) = pvVar5;
          *(void **)((long)pvVar4 + uVar10 * 0x48 + 0x20) = (void *)(sVar7 + (long)pvVar5);
          if (*(long *)((long)pvVar4 + uVar10 * 0x48 + 0x30) != 0 && 0 < (int)uVar2) {
            lVar11 = 0;
            uVar8 = (ulong)uVar2;
            do {
              (**(code **)((long)pvVar4 + uVar10 * 0x48 + 0x30))
                        ((lVar11 >> 0x20) + *(long *)((long)pvVar4 + uVar10 * 0x48 + 0x18),
                         *(undefined8 *)((long)pvVar4 + uVar10 * 0x48 + 0x40));
              lVar11 = lVar11 + (lVar9 << 0x20);
              uVar8 = uVar8 - 1;
            } while (uVar8 != 0);
          }
        }
        else {
          pvVar5 = ___kmp_allocate((long)(int)uVar2 * 8);
          *(void **)((long)pvVar4 + uVar10 * 0x48 + 0x18) = pvVar5;
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 != (uint)num);
    }
    pkVar3->reduce_data = pvVar4;
    pkVar3->reduce_num_data = num;
  }
  return pkVar3;
}

Assistant:

void *__kmp_task_reduction_init(int gtid, int num, T *data) {
  kmp_info_t *thread = __kmp_threads[gtid];
  kmp_taskgroup_t *tg = thread->th.th_current_task->td_taskgroup;
  kmp_int32 nth = thread->th.th_team_nproc;
  kmp_taskred_data_t *arr;

  // check input data just in case
  KMP_ASSERT(tg != NULL);
  KMP_ASSERT(data != NULL);
  KMP_ASSERT(num > 0);
  if (nth == 1) {
    KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, tg %p, exiting nth=1\n",
                  gtid, tg));
    return (void *)tg;
  }
  KA_TRACE(10, ("__kmpc_task_reduction_init: T#%d, taskgroup %p, #items %d\n",
                gtid, tg, num));
  arr = (kmp_taskred_data_t *)__kmp_thread_malloc(
      thread, num * sizeof(kmp_taskred_data_t));
  for (int i = 0; i < num; ++i) {
    size_t size = data[i].reduce_size - 1;
    // round the size up to cache line per thread-specific item
    size += CACHE_LINE - size % CACHE_LINE;
    KMP_ASSERT(data[i].reduce_comb != NULL); // combiner is mandatory
    arr[i].reduce_shar = data[i].reduce_shar;
    arr[i].reduce_size = size;
    arr[i].flags = data[i].flags;
    arr[i].reduce_comb = data[i].reduce_comb;
    arr[i].reduce_init = data[i].reduce_init;
    arr[i].reduce_fini = data[i].reduce_fini;
    __kmp_assign_orig<T>(arr[i], data[i]);
    if (!arr[i].flags.lazy_priv) {
      // allocate cache-line aligned block and fill it with zeros
      arr[i].reduce_priv = __kmp_allocate(nth * size);
      arr[i].reduce_pend = (char *)(arr[i].reduce_priv) + nth * size;
      if (arr[i].reduce_init != NULL) {
        // initialize all thread-specific items
        for (int j = 0; j < nth; ++j) {
          __kmp_call_init<T>(arr[i], j * size);
        }
      }
    } else {
      // only allocate space for pointers now,
      // objects will be lazily allocated/initialized if/when requested
      // note that __kmp_allocate zeroes the allocated memory
      arr[i].reduce_priv = __kmp_allocate(nth * sizeof(void *));
    }
  }
  tg->reduce_data = (void *)arr;
  tg->reduce_num_data = num;
  return (void *)tg;
}